

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderMatrixCase::init(ShaderMatrixCase *this,EVP_PKEY_CTX *ctx)

{
  string *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  OperationNature OVar4;
  OperationType OVar5;
  uint uVar6;
  TestMatrixType TVar7;
  int iVar8;
  ostream *poVar9;
  char *pcVar10;
  reference pbVar11;
  reference pvVar12;
  float *pfVar13;
  int precision;
  EVP_PKEY_CTX *ctx_00;
  float fVar14;
  char *local_978;
  char *local_910;
  string *local_868;
  ShaderInput *local_850;
  int local_83c;
  DataType local_834;
  DataType local_830;
  ostream *local_7f0;
  int local_7dc;
  uint local_7d8;
  int col;
  int row;
  int attribNdx_1;
  int local_78c;
  string local_788 [4];
  int attribNdx;
  string local_768 [32];
  string local_748;
  string local_728;
  string local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6d0;
  const_iterator copyIter;
  allocator<char> local_6a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  Matrix<float,_4,_4> local_65c;
  Matrix<float,_3,_4> local_61c;
  Matrix<float,_2,_4> local_5ec;
  Matrix<float,_4,_3> local_5cc;
  Matrix<float,_3,_3> local_59c;
  Matrix<float,_2,_3> local_578;
  Matrix<float,_4,_2> local_560;
  Matrix<float,_3,_2> local_540;
  Matrix<float,_2,_2> local_528;
  string local_518;
  string local_4f8;
  allocator<char> local_4d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  allocator<char> local_489;
  value_type local_488;
  allocator<char> local_461;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  allocator<char> local_419;
  value_type local_418;
  string *local_3f8;
  string *inValue;
  char *typeName;
  char *precName;
  ShaderInput *in;
  int inNdx;
  DataType otherType;
  DataType matrixType;
  int matNdx;
  string operationValue1;
  string operationValue0;
  undefined1 local_380 [4];
  int numInputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  Precision resultPrec;
  DataType resultType;
  string inValue1;
  string inValue0;
  bool isInDynMat1;
  bool isInDynMat0;
  ostringstream *op;
  undefined1 local_300 [8];
  ostringstream frag;
  ostringstream vtx;
  ShaderMatrixCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_300);
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_7f0 = (ostream *)local_300;
  }
  else {
    local_7f0 = (ostream *)&frag.field_0x170;
  }
  glu::isDataTypeMatrix((this->m_in0).dataType);
  glu::isDataTypeMatrix((this->m_in1).dataType);
  std::__cxx11::string::string((string *)(inValue1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&resultPrec);
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = TYPE_LAST;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (this->m_in0).precision;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_380);
  bVar1 = MatrixCaseUtils::isOperationBinary(this->m_op);
  iVar8 = 1;
  if (bVar1) {
    iVar8 = 2;
  }
  std::__cxx11::string::string((string *)(operationValue1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&matrixType);
  if (((this->m_op == OP_MUL) && (bVar1 = glu::isDataTypeMatrix((this->m_in0).dataType), bVar1)) &&
     (bVar1 = glu::isDataTypeMatrix((this->m_in1).dataType), bVar1)) {
    iVar2 = glu::getDataTypeMatrixNumColumns((this->m_in1).dataType);
    iVar3 = glu::getDataTypeMatrixNumRows((this->m_in0).dataType);
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = glu::getDataTypeMatrix(iVar2,iVar3);
  }
  else if (this->m_op == OP_OUTER_PRODUCT) {
    iVar2 = glu::getDataTypeScalarSize((this->m_in1).dataType);
    iVar3 = glu::getDataTypeScalarSize((this->m_in0).dataType);
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = glu::getDataTypeMatrix(iVar2,iVar3);
  }
  else if (this->m_op == OP_TRANSPOSE) {
    iVar2 = glu::getDataTypeMatrixNumRows((this->m_in0).dataType);
    iVar3 = glu::getDataTypeMatrixNumColumns((this->m_in0).dataType);
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = glu::getDataTypeMatrix(iVar2,iVar3);
  }
  else if (this->m_op == OP_INVERSE) {
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->m_in0).dataType;
  }
  else if (this->m_op == OP_DETERMINANT) {
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = TYPE_FLOAT;
  }
  else {
    OVar5 = MatrixCaseUtils::getOperationType(this->m_op);
    if ((OVar5 == OPERATIONTYPE_UNARY_PREFIX_OPERATOR) ||
       (OVar5 = MatrixCaseUtils::getOperationType(this->m_op),
       OVar5 == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)) {
      passVars.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->m_in0).dataType;
    }
    else {
      bVar1 = glu::isDataTypeMatrix((this->m_in0).dataType);
      if ((bVar1) && (bVar1 = glu::isDataTypeMatrix((this->m_in1).dataType), bVar1)) {
        passVars.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->m_in0).dataType;
      }
      else {
        bVar1 = glu::isDataTypeMatrix((this->m_in0).dataType);
        if ((bVar1) || (bVar1 = glu::isDataTypeMatrix((this->m_in1).dataType), bVar1)) {
          bVar1 = glu::isDataTypeMatrix((this->m_in0).dataType);
          otherType = (DataType)!bVar1;
          if (otherType == TYPE_INVALID) {
            local_830 = (this->m_in0).dataType;
          }
          else {
            local_830 = (this->m_in1).dataType;
          }
          inNdx = local_830;
          if (otherType == TYPE_INVALID) {
            local_834 = (this->m_in1).dataType;
          }
          else {
            local_834 = (this->m_in0).dataType;
          }
          in._4_4_ = local_834;
          if (local_834 == TYPE_FLOAT) {
            passVars.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_830;
          }
          else {
            if (otherType == TYPE_INVALID) {
              local_83c = glu::getDataTypeMatrixNumRows(local_830);
            }
            else {
              local_83c = glu::getDataTypeMatrixNumColumns(local_830);
            }
            passVars.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 glu::getDataTypeFloatVec(local_83c);
          }
        }
      }
    }
  }
  std::operator<<((ostream *)&frag.field_0x170,"#version 300 es\n");
  std::operator<<((ostream *)local_300,"#version 300 es\n");
  std::operator<<((ostream *)&frag.field_0x170,"in highp vec4 a_position;\n");
  std::operator<<((ostream *)local_300,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    std::operator<<((ostream *)&frag.field_0x170,"out mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_300,"in mediump vec4 v_color;\n");
  }
  for (in._0_4_ = 0; (int)in < iVar8; in._0_4_ = (int)in + 1) {
    if ((int)in < 1) {
      local_850 = &this->m_in0;
    }
    else {
      local_850 = &this->m_in1;
    }
    precName = (char *)local_850;
    typeName = glu::getPrecisionName(local_850->precision);
    inValue = (string *)glu::getDataTypeName(*(DataType *)(precName + 4));
    if ((int)in < 1) {
      local_868 = (string *)((long)&inValue1.field_2 + 8);
    }
    else {
      local_868 = (string *)&resultPrec;
    }
    local_3f8 = local_868;
    if (*(int *)precName == 2) {
      poVar9 = std::operator<<((ostream *)&frag.field_0x170,"in ");
      poVar9 = std::operator<<(poVar9,typeName);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,(char *)inValue);
      std::operator<<(poVar9," a_");
      bVar1 = glu::isDataTypeMatrix(*(DataType *)(precName + 4));
      if (bVar1) {
        poVar9 = std::operator<<((ostream *)&frag.field_0x170,(char *)inValue);
        std::operator<<(poVar9,";\n");
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          poVar9 = std::operator<<((ostream *)&frag.field_0x170,"out ");
          poVar9 = std::operator<<(poVar9,typeName);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,(char *)inValue);
          poVar9 = std::operator<<(poVar9," v_");
          poVar9 = std::operator<<(poVar9,(char *)inValue);
          std::operator<<(poVar9,";\n");
          poVar9 = std::operator<<((ostream *)local_300,"in ");
          poVar9 = std::operator<<(poVar9,typeName);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,(char *)inValue);
          poVar9 = std::operator<<(poVar9," v_");
          poVar9 = std::operator<<(poVar9,(char *)inValue);
          std::operator<<(poVar9,";\n");
          __s = inValue;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_418,(char *)__s,&local_419);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_380,&local_418);
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator(&local_419);
        }
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          local_910 = "v_";
        }
        else {
          local_910 = "a_";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_460,local_910,&local_461);
        pcVar10 = glu::getDataTypeName(*(DataType *)(precName + 4));
        std::operator+(&local_440,&local_460,pcVar10);
        std::__cxx11::string::operator=(local_3f8,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        std::__cxx11::string::~string((string *)&local_460);
        std::allocator<char>::~allocator(&local_461);
      }
      else {
        std::operator<<((ostream *)&frag.field_0x170,"coords;\n");
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          poVar9 = std::operator<<((ostream *)&frag.field_0x170,"out ");
          poVar9 = std::operator<<(poVar9,typeName);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,(char *)inValue);
          std::operator<<(poVar9," v_coords;\n");
          poVar9 = std::operator<<((ostream *)local_300,"in ");
          poVar9 = std::operator<<(poVar9,typeName);
          poVar9 = std::operator<<(poVar9," ");
          poVar9 = std::operator<<(poVar9,(char *)inValue);
          std::operator<<(poVar9," v_coords;\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_488,"coords",&local_489);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_380,&local_488);
          std::__cxx11::string::~string((string *)&local_488);
          std::allocator<char>::~allocator(&local_489);
        }
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          local_978 = "v_coords";
        }
        else {
          local_978 = "a_coords";
        }
        std::__cxx11::string::operator=(local_3f8,local_978);
      }
    }
    else if (*(int *)precName == 1) {
      poVar9 = std::operator<<(local_7f0,"uniform ");
      poVar9 = std::operator<<(poVar9,typeName);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,(char *)inValue);
      poVar9 = std::operator<<(poVar9," u_in");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)in);
      std::operator<<(poVar9,";\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"u_in",&local_4d1);
      de::toString<int>(&local_4f8,(int *)&in);
      std::operator+(&local_4b0,&local_4d0,&local_4f8);
      std::__cxx11::string::operator=(local_3f8,(string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_4f8);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::allocator<char>::~allocator(&local_4d1);
    }
    else if (*(int *)precName == 0) {
      poVar9 = std::operator<<(local_7f0,"const ");
      poVar9 = std::operator<<(poVar9,typeName);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,(char *)inValue);
      poVar9 = std::operator<<(poVar9," in");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)in);
      std::operator<<(poVar9," = ");
      switch(*(undefined4 *)(precName + 4)) {
      case 1:
        de::floatToString_abi_cxx11_
                  (&local_518,(de *)&DAT_00000001,
                   *(float *)((long)&s_constInFloat + (long)(int)in * 4),precision);
        std::operator<<(local_7f0,(string *)&local_518);
        std::__cxx11::string::~string((string *)&local_518);
        break;
      case 2:
        MatrixCaseUtils::writeVectorConstructor<2>
                  (local_7f0,(Vector<float,_2> *)(s_constInVec2 + (long)(int)in * 8));
        break;
      case 3:
        MatrixCaseUtils::writeVectorConstructor<3>
                  (local_7f0,(Vector<float,_3> *)(s_constInVec3 + (long)(int)in * 0xc));
        break;
      case 4:
        MatrixCaseUtils::writeVectorConstructor<4>
                  (local_7f0,(Vector<float,_4> *)(s_constInVec4 + (long)(int)in * 0x10));
        break;
      case 5:
        tcu::Matrix<float,_2,_2>::Matrix
                  (&local_528,(float *)(s_constInMat2x2 + (long)(int)in * 0x10));
        MatrixCaseUtils::writeMatrixConstructor<2,2>(local_7f0,&local_528);
        tcu::Matrix<float,_2,_2>::~Matrix(&local_528);
        break;
      case 6:
        tcu::Matrix<float,_3,_2>::Matrix
                  (&local_540,(float *)(s_constInMat2x3 + (long)(int)in * 0x18));
        MatrixCaseUtils::writeMatrixConstructor<2,3>(local_7f0,&local_540);
        tcu::Matrix<float,_3,_2>::~Matrix(&local_540);
        break;
      case 7:
        tcu::Matrix<float,_4,_2>::Matrix
                  (&local_560,(float *)(s_constInMat2x4 + (long)(int)in * 0x20));
        MatrixCaseUtils::writeMatrixConstructor<2,4>(local_7f0,&local_560);
        tcu::Matrix<float,_4,_2>::~Matrix(&local_560);
        break;
      case 8:
        tcu::Matrix<float,_2,_3>::Matrix
                  (&local_578,(float *)(s_constInMat3x2 + (long)(int)in * 0x18));
        MatrixCaseUtils::writeMatrixConstructor<3,2>(local_7f0,&local_578);
        tcu::Matrix<float,_2,_3>::~Matrix(&local_578);
        break;
      case 9:
        tcu::Matrix<float,_3,_3>::Matrix
                  (&local_59c,(float *)(s_constInMat3x3 + (long)(int)in * 0x24));
        MatrixCaseUtils::writeMatrixConstructor<3,3>(local_7f0,&local_59c);
        tcu::Matrix<float,_3,_3>::~Matrix(&local_59c);
        break;
      case 10:
        tcu::Matrix<float,_4,_3>::Matrix
                  (&local_5cc,(float *)(s_constInMat3x4 + (long)(int)in * 0x30));
        MatrixCaseUtils::writeMatrixConstructor<3,4>(local_7f0,&local_5cc);
        tcu::Matrix<float,_4,_3>::~Matrix(&local_5cc);
        break;
      case 0xb:
        tcu::Matrix<float,_2,_4>::Matrix
                  (&local_5ec,(float *)(s_constInMat4x2 + (long)(int)in * 0x20));
        MatrixCaseUtils::writeMatrixConstructor<4,2>(local_7f0,&local_5ec);
        tcu::Matrix<float,_2,_4>::~Matrix(&local_5ec);
        break;
      case 0xc:
        tcu::Matrix<float,_3,_4>::Matrix
                  (&local_61c,(float *)(s_constInMat4x3 + (long)(int)in * 0x30));
        MatrixCaseUtils::writeMatrixConstructor<4,3>(local_7f0,&local_61c);
        tcu::Matrix<float,_3,_4>::~Matrix(&local_61c);
        break;
      case 0xd:
        tcu::Matrix<float,_4,_4>::Matrix
                  (&local_65c,(float *)(s_constInMat4x4 + (long)(int)in * 0x40));
        MatrixCaseUtils::writeMatrixConstructor<4,4>(local_7f0,&local_65c);
        tcu::Matrix<float,_4,_4>::~Matrix(&local_65c);
      }
      std::operator<<(local_7f0,";\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"in",&local_6a1);
      de::toString<int>((string *)&copyIter,(int *)&in);
      std::operator+(&local_680,&local_6a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copyIter)
      ;
      std::__cxx11::string::operator=(local_3f8,(string *)&local_680);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string((string *)&copyIter);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::allocator<char>::~allocator(&local_6a1);
    }
  }
  poVar9 = std::operator<<((ostream *)&frag.field_0x170,"\n");
  poVar9 = std::operator<<(poVar9,"void main (void)\n");
  poVar9 = std::operator<<(poVar9,"{\n");
  std::operator<<(poVar9,"\tgl_Position = a_position;\n");
  poVar9 = std::operator<<((ostream *)local_300,"\n");
  poVar9 = std::operator<<(poVar9,"void main (void)\n");
  std::operator<<(poVar9,"{\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_6d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_380);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_6d0,&local_6d8);
    while( true ) {
      local_6e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_380);
      bVar1 = __gnu_cxx::operator!=(&local_6d0,&local_6e0);
      if (!bVar1) break;
      poVar9 = std::operator<<((ostream *)&frag.field_0x170,"\tv_");
      pbVar11 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_6d0);
      poVar9 = std::operator<<(poVar9,(string *)pbVar11);
      poVar9 = std::operator<<(poVar9," = ");
      poVar9 = std::operator<<(poVar9,"a_");
      pbVar11 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_6d0);
      poVar9 = std::operator<<(poVar9,(string *)pbVar11);
      std::operator<<(poVar9,";\n");
      local_6e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_6d0,0);
    }
  }
  else {
    std::operator<<((ostream *)local_300,"\tdEQP_FragColor = v_color;\n");
  }
  OVar4 = MatrixCaseUtils::getOperationNature(this->m_op);
  if (OVar4 == OPERATIONNATURE_PURE) {
    std::__cxx11::string::operator=
              ((string *)(operationValue1.field_2._M_local_buf + 8),
               (string *)(inValue1.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&matrixType,(string *)&resultPrec);
  }
  else if (OVar4 == OPERATIONNATURE_MUTATING) {
    poVar9 = std::operator<<(local_7f0,"\t");
    pcVar10 = glu::getPrecisionName
                        ((Precision)
                         passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," ");
    pcVar10 = glu::getDataTypeName
                        (passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," tmpValue = ");
    poVar9 = std::operator<<(poVar9,(string *)(inValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar9,";\n");
    std::__cxx11::string::operator=((string *)(operationValue1.field_2._M_local_buf + 8),"tmpValue")
    ;
    std::__cxx11::string::operator=((string *)&matrixType,(string *)&resultPrec);
  }
  else if (OVar4 == OPERATIONNATURE_ASSIGNMENT) {
    std::__cxx11::string::operator=
              ((string *)(operationValue1.field_2._M_local_buf + 8),
               (string *)(inValue1.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&matrixType,(string *)&resultPrec);
  }
  OVar5 = MatrixCaseUtils::getOperationType(this->m_op);
  switch(OVar5) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    poVar9 = std::operator<<(local_7f0,"\t");
    pcVar10 = glu::getPrecisionName
                        ((Precision)
                         passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," ");
    pcVar10 = glu::getDataTypeName
                        (passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," res = ");
    poVar9 = std::operator<<(poVar9,(string *)(operationValue1.field_2._M_local_buf + 8));
    poVar9 = std::operator<<(poVar9," ");
    pcVar10 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,(string *)&matrixType);
    std::operator<<(poVar9,";\n");
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    poVar9 = std::operator<<(local_7f0,"\t");
    pcVar10 = glu::getPrecisionName
                        ((Precision)
                         passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," ");
    pcVar10 = glu::getDataTypeName
                        (passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," res = ");
    pcVar10 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = std::operator<<(poVar9,(string *)(operationValue1.field_2._M_local_buf + 8));
    poVar9 = std::operator<<(poVar9,", ");
    poVar9 = std::operator<<(poVar9,(string *)&matrixType);
    std::operator<<(poVar9,");\n");
    break;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    poVar9 = std::operator<<(local_7f0,"\t");
    pcVar10 = glu::getPrecisionName
                        ((Precision)
                         passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," ");
    pcVar10 = glu::getDataTypeName
                        (passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," res = ");
    pcVar10 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9,(string *)(operationValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar9,";\n");
    break;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    poVar9 = std::operator<<(local_7f0,"\t");
    pcVar10 = glu::getPrecisionName
                        ((Precision)
                         passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," ");
    pcVar10 = glu::getDataTypeName
                        (passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," res = ");
    poVar9 = std::operator<<(poVar9,(string *)(operationValue1.field_2._M_local_buf + 8));
    pcVar10 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar9 = std::operator<<(poVar9,pcVar10);
    std::operator<<(poVar9,";\n");
    break;
  case OPERATIONTYPE_UNARY_FUNCTION:
    poVar9 = std::operator<<(local_7f0,"\t");
    pcVar10 = glu::getPrecisionName
                        ((Precision)
                         passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," ");
    pcVar10 = glu::getDataTypeName
                        (passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," res = ");
    pcVar10 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9,"(");
    poVar9 = std::operator<<(poVar9,(string *)(operationValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar9,");\n");
    break;
  case OPERATIONTYPE_ASSIGNMENT:
    poVar9 = std::operator<<(local_7f0,"\t");
    pcVar10 = glu::getPrecisionName
                        ((Precision)
                         passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," ");
    pcVar10 = glu::getDataTypeName
                        (passVars.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," res = ");
    poVar9 = std::operator<<(poVar9,(string *)(operationValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar9,";\n");
    poVar9 = std::operator<<(local_7f0,"\tres ");
    pcVar10 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar9 = std::operator<<(poVar9,pcVar10);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,(string *)&matrixType);
    std::operator<<(poVar9,";\n");
  }
  poVar9 = std::operator<<(local_7f0,"\t");
  pcVar10 = "dEQP_FragColor";
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    pcVar10 = "v_color";
  }
  poVar9 = std::operator<<(poVar9,pcVar10);
  std::operator<<(poVar9," = ");
  bVar1 = MatrixCaseUtils::isOperationValueModifying(this->m_op);
  if (bVar1) {
    poVar9 = std::operator<<(local_7f0,"vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_708,this,
               (DataType *)
               ((long)&passVars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),"res");
    poVar9 = std::operator<<(poVar9,(string *)&local_708);
    poVar9 = std::operator<<(poVar9,", 1.0) + vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_728,this,
               (DataType *)
               ((long)&passVars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),"tmpValue");
    poVar9 = std::operator<<(poVar9,(string *)&local_728);
    std::operator<<(poVar9,", 0.0);\n");
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&local_708);
  }
  else {
    poVar9 = std::operator<<(local_7f0,"vec4(");
    genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_748,this,
               (DataType *)
               ((long)&passVars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),"res");
    poVar9 = std::operator<<(poVar9,(string *)&local_748);
    std::operator<<(poVar9,", 1.0);\n");
    std::__cxx11::string::~string((string *)&local_748);
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_300,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_768);
  std::__cxx11::string::~string(local_768);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_788);
  std::__cxx11::string::~string(local_788);
  ctx_00 = (EVP_PKEY_CTX *)&DAT_00000004;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (&(this->super_ShaderRenderCase).m_userAttribTransforms,4);
  for (local_78c = 0; local_78c < 4; local_78c = local_78c + 1) {
    row = 0;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&attribNdx_1,(float *)&row);
    pvVar12 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_78c);
    tcu::Matrix<float,_4,_4>::operator=(pvVar12,(Matrix<float,_4,_4> *)&attribNdx_1);
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)&attribNdx_1);
    pvVar12 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_78c);
    pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,0,3);
    *pfVar13 = 0.2;
    pvVar12 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_78c);
    pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,1,3);
    *pfVar13 = 0.1;
    fVar14 = (float)local_78c;
    pvVar12 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_78c);
    pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,2,3);
    *pfVar13 = fVar14 * 0.15 + 0.4;
    pvVar12 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_78c);
    pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,3,3);
    *pfVar13 = 0.7;
    pvVar12 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_78c);
    pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,local_78c % 4,0);
    *pfVar13 = 1.0;
    pvVar12 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_78c);
    uVar6 = local_78c + 1U;
    if ((int)(local_78c + 1U) < 0) {
      uVar6 = local_78c + 4;
    }
    pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,(local_78c + 1) - (uVar6 & 0xfffffffc),1)
    ;
    *pfVar13 = 1.0;
    pvVar12 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_78c);
    uVar6 = local_78c + 2U;
    if ((int)(local_78c + 2U) < 0) {
      uVar6 = local_78c + 5;
    }
    pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,(local_78c + 2) - (uVar6 & 0xfffffffc),2)
    ;
    *pfVar13 = 1.0;
    pvVar12 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)local_78c);
    uVar6 = local_78c + 3U;
    if ((int)(local_78c + 3U) < 0) {
      uVar6 = local_78c + 6;
    }
    uVar6 = (local_78c + 3) - (uVar6 & 0xfffffffc);
    ctx_00 = (EVP_PKEY_CTX *)(ulong)uVar6;
    pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,uVar6,3);
    *pfVar13 = 1.0;
  }
  TVar7 = MatrixCaseUtils::getOperationTestMatrixType(this->m_op);
  if (TVar7 != TESTMATRIXTYPE_DEFAULT) {
    for (col = 0; col < 4; col = col + 1) {
      for (local_7d8 = 0; (int)local_7d8 < 4; local_7d8 = local_7d8 + 1) {
        for (local_7dc = 0; local_7dc < 4; local_7dc = local_7dc + 1) {
          TVar7 = MatrixCaseUtils::getOperationTestMatrixType(this->m_op);
          switch(TVar7) {
          case TESTMATRIXTYPE_NEGATED:
            pvVar12 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,local_7d8,local_7dc);
            fVar14 = *pfVar13;
            pvVar12 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            ctx_00 = (EVP_PKEY_CTX *)(ulong)local_7d8;
            pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,local_7d8,local_7dc);
            *pfVar13 = -fVar14;
            break;
          case TESTMATRIXTYPE_INCREMENTED:
            pvVar12 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            ctx_00 = (EVP_PKEY_CTX *)(ulong)local_7d8;
            pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,local_7d8,local_7dc);
            *pfVar13 = *pfVar13 + 0.3;
            break;
          case TESTMATRIXTYPE_DECREMENTED:
            pvVar12 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            ctx_00 = (EVP_PKEY_CTX *)(ulong)local_7d8;
            pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,local_7d8,local_7dc);
            *pfVar13 = *pfVar13 - 0.3;
            break;
          case TESTMATRIXTYPE_NEGATED_INCREMENTED:
            pvVar12 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,local_7d8,local_7dc);
            fVar14 = *pfVar13;
            pvVar12 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            ctx_00 = (EVP_PKEY_CTX *)(ulong)local_7d8;
            pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,local_7d8,local_7dc);
            *pfVar13 = 0.3 - fVar14;
            break;
          case TESTMATRIXTYPE_INCREMENTED_LESS:
            pvVar12 = std::
                      vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
                      operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)col);
            ctx_00 = (EVP_PKEY_CTX *)(ulong)local_7d8;
            pfVar13 = tcu::Matrix<float,_4,_4>::operator()(pvVar12,local_7d8,local_7dc);
            *pfVar13 = *pfVar13 - 0.1;
          }
        }
      }
    }
  }
  deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx_00);
  std::__cxx11::string::~string((string *)&matrixType);
  std::__cxx11::string::~string((string *)(operationValue1.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_380);
  std::__cxx11::string::~string((string *)&resultPrec);
  std::__cxx11::string::~string((string *)(inValue1.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_300);
  iVar8 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return iVar8;
}

Assistant:

void ShaderMatrixCase::init (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (m_op == OP_MUL && isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumColumns(m_in1.dataType), getDataTypeMatrixNumRows(m_in0.dataType));
	}
	else if (m_op == OP_OUTER_PRODUCT)
	{
		resultType = getDataTypeMatrix(getDataTypeScalarSize(m_in1.dataType), getDataTypeScalarSize(m_in0.dataType));
	}
	else if (m_op == OP_TRANSPOSE)
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumRows(m_in0.dataType), getDataTypeMatrixNumColumns(m_in0.dataType));
	}
	else if (m_op == OP_INVERSE)
	{
		resultType = m_in0.dataType;
	}
	else if (m_op == OP_DETERMINANT)
	{
		resultType = TYPE_FLOAT;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) || isDataTypeMatrix(m_in1.dataType))
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = getDataTypeFloatVec(matNdx == 0 ? getDataTypeMatrixNumRows(matrixType) : getDataTypeMatrixNumColumns(matrixType));
		}
	}
	else
	{
		DE_ASSERT(DE_FALSE);
	}

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n";

	vtx << "in highp vec4 a_position;\n";
	frag << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	if (m_isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}

	// Input declarations.
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			vtx << "in " << precName << " " << typeName << " a_";

			if (isDataTypeMatrix(in.dataType))
			{
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "out " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "in " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "out " << precName << " " << typeName << " v_coords;\n";
					frag << "in " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "uniform " << precName << " " << typeName << " u_in" << inNdx << ";\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2x2[inNdx]));		break;
				case TYPE_FLOAT_MAT2X3:	writeMatrixConstructor<2, 3>(op, Mat2x3(s_constInMat2x3[inNdx]));	break;
				case TYPE_FLOAT_MAT2X4:	writeMatrixConstructor<2, 4>(op, Mat2x4(s_constInMat2x4[inNdx]));	break;
				case TYPE_FLOAT_MAT3X2:	writeMatrixConstructor<3, 2>(op, Mat3x2(s_constInMat3x2[inNdx]));	break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3x3[inNdx]));		break;
				case TYPE_FLOAT_MAT3X4:	writeMatrixConstructor<3, 4>(op, Mat3x4(s_constInMat3x4[inNdx]));	break;
				case TYPE_FLOAT_MAT4X2:	writeMatrixConstructor<4, 2>(op, Mat4x2(s_constInMat4x2[inNdx]));	break;
				case TYPE_FLOAT_MAT4X3:	writeMatrixConstructor<4, 3>(op, Mat4x3(s_constInMat4x3[inNdx]));	break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4x4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
		frag << "	dEQP_FragColor = v_color;\n";
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_UNARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified
	op << "	" << (m_isVertexCase ? "v_color" : "dEQP_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();

	// \todo [2012-02-14 pyry] Compute better values for matrix tests.
	m_userAttribTransforms.resize(4);
	for (int attribNdx = 0; attribNdx < 4; attribNdx++)
	{
		m_userAttribTransforms[attribNdx] = Mat4(0.0f);
		m_userAttribTransforms[attribNdx](                  0, 3) = 0.2f;								// !< prevent matrix*vec from going into zero (assuming vec.w != 0)
		m_userAttribTransforms[attribNdx](                  1, 3) = 0.1f;								// !<
		m_userAttribTransforms[attribNdx](                  2, 3) = 0.4f + 0.15f * float(attribNdx);	// !<
		m_userAttribTransforms[attribNdx](                  3, 3) = 0.7f;								// !<
		m_userAttribTransforms[attribNdx]((0 + attribNdx) % 4, 0) = 1.0f;
		m_userAttribTransforms[attribNdx]((1 + attribNdx) % 4, 1) = 1.0f;
		m_userAttribTransforms[attribNdx]((2 + attribNdx) % 4, 2) = 1.0f;
		m_userAttribTransforms[attribNdx]((3 + attribNdx) % 4, 3) = 1.0f;
	}

	// prevent bad reference cases such as black result images by fine-tuning used matrices
	if (getOperationTestMatrixType(m_op) != TESTMATRIXTYPE_DEFAULT)
	{
		for (int attribNdx = 0; attribNdx < 4; attribNdx++)
		{
			for (int row = 0; row < 4; row++)
			for (int col = 0; col < 4; col++)
			{
				switch (getOperationTestMatrixType(m_op))
				{
					case TESTMATRIXTYPE_NEGATED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col);
						break;
					case TESTMATRIXTYPE_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) += 0.3f;
						break;
					case TESTMATRIXTYPE_DECREMENTED:
						m_userAttribTransforms[attribNdx](row, col) -= 0.3f;
						break;
					case TESTMATRIXTYPE_NEGATED_INCREMENTED:
						m_userAttribTransforms[attribNdx](row, col) = -m_userAttribTransforms[attribNdx](row, col) + 0.3f;
						break;
					case TESTMATRIXTYPE_INCREMENTED_LESS:
						m_userAttribTransforms[attribNdx](row, col) -= 0.1f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
						break;
				}
			}
		}
	}

	ShaderRenderCase::init();
}